

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void __thiscall
duckdb::TemplatedValidityMask<unsigned_long>::SetValid
          (TemplatedValidityMask<unsigned_long> *this,idx_t row_idx)

{
  ulong *puVar1;
  
  if (this->validity_mask != (unsigned_long *)0x0) {
    puVar1 = this->validity_mask + (row_idx >> 6);
    *puVar1 = *puVar1 | 1L << ((byte)row_idx & 0x3f);
  }
  return;
}

Assistant:

inline void SetValid(idx_t row_idx) {
#ifdef DEBUG
		if (row_idx >= capacity) {
			throw InternalException("ValidityMask::SetValid - row_idx %d is out-of-range for mask with capacity %llu",
			                        row_idx, capacity);
		}
#endif
		if (!validity_mask) {
			// if AllValid() we don't need to do anything
			// the row is already valid
			return;
		}
		SetValidUnsafe(row_idx);
	}